

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# components.hpp
# Opt level: O3

void __thiscall
cs::
stack_type<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator>
::destroy(stack_type<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator>
          *this)

{
  pointer pcVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  
  pbVar3 = this->m_start;
  pbVar4 = this->m_current;
  if (pbVar4 != pbVar3) {
    do {
      this->m_current = pbVar4 + -1;
      pcVar1 = pbVar4[-1]._M_dataplus._M_p;
      pbVar2 = pbVar4 + -1;
      pbVar4 = pbVar4 + -1;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar1 != &pbVar2->field_2) {
        operator_delete(pcVar1,(pbVar2->field_2)._M_allocated_capacity + 1);
        pbVar3 = this->m_start;
        pbVar4 = this->m_current;
      }
    } while (pbVar4 != pbVar3);
  }
  operator_delete(this->m_data,this->m_size << 5);
  return;
}

Assistant:

void destroy()
		{
			while (m_current != m_start)
				(--m_current)->~T();
			m_alloc.deallocate(m_data, m_size);
		}